

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O0

bool __thiscall senjo::UCIAdapter::QuitCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  Output *this_00;
  Output local_40 [3];
  Output local_28;
  char *local_20;
  char *params_local;
  UCIAdapter *this_local;
  
  local_20 = params;
  params_local = (char *)this;
  bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&local_20);
  if (bVar1) {
    Output::Output(&local_28,InfoPrefix);
    this_00 = Output::operator<<(&local_28,(char (*) [8])"usage: ");
    Output::operator<<(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               token::Quit_abi_cxx11_);
    Output::~Output(&local_28);
    Output::Output(local_40,InfoPrefix);
    Output::operator<<(local_40,(char (*) [35])"Stop engine and terminate program.");
    Output::~Output(local_40);
  }
  else {
    (*this->engine->_vptr_ChessEngine[0x1b])();
    Thread::Join(&this->thread);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool UCIAdapter::QuitCommand(const char *params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Quit;
    Output() << "Stop engine and terminate program.";
    return false;
  }
  engine->Quit();
  thread.Join();
  return true;
}